

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O2

void __thiscall MathOp::Raw_Tanh::back(Raw_Tanh *this)

{
  int *piVar1;
  bool bVar2;
  Mat *pMVar3;
  Mat *a;
  Mat MStack_e8;
  Mat local_c0;
  Mat local_98;
  Mat local_70;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  piVar1 = &(this->super_Op).backRound;
  *piVar1 = *piVar1 + 1;
  bVar2 = NeuronMat::getIsBack(this->a);
  if (!bVar2) {
    pMVar3 = NeuronMat::getForward(this->res);
    local_30 = 0;
    local_38 = 0x100000;
    Mat::operator+(&local_98,pMVar3,(ll128 *)&local_38);
    pMVar3 = NeuronMat::getForward(this->res);
    Mat::oneMinus_IE(&local_70,pMVar3);
    Mat::dot(&local_c0,&local_98,&local_70);
    local_40 = 0;
    local_48 = 0x100000;
    Mat::operator/(&MStack_e8,&local_c0,(ll128 *)&local_48);
    pMVar3 = NeuronMat::getGrad(this->a);
    Mat::operator=(pMVar3,&MStack_e8);
    Mat::~Mat(&MStack_e8);
    Mat::~Mat(&local_c0);
    Mat::~Mat(&local_70);
    Mat::~Mat(&local_98);
    pMVar3 = NeuronMat::getGrad(this->a);
    a = NeuronMat::getGrad(this->res);
    Mat::dot(&local_c0,pMVar3,a);
    local_98.order = 0;
    local_98._12_4_ = 0;
    local_98.r = 0x100000;
    local_98.c = 0;
    Mat::operator/(&MStack_e8,&local_c0,(ll128 *)&local_98);
    pMVar3 = NeuronMat::getGrad(this->a);
    Mat::operator=(pMVar3,&MStack_e8);
    Mat::~Mat(&MStack_e8);
    Mat::~Mat(&local_c0);
  }
  return;
}

Assistant:

void MathOp::Raw_Tanh::back(){
    backRound++;
    if (!a->getIsBack()){
        *a->getGrad()=(*res->getForward()+IE).dot(res->getForward()->oneMinus_IE())/IE;
        *a->getGrad()=a->getGrad()->dot(*res->getGrad())/IE;

    }
}